

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_gramma_analysis.cpp
# Opt level: O3

compile_errcode __thiscall Factor::Parse(Factor *this)

{
  LogTools *log_tools_ptr;
  SymbolName SVar1;
  compile_errcode cVar2;
  char *pcVar3;
  char *pcVar4;
  string str;
  string local_38;
  
  SVar1 = SymbolQueue::GetCurrentName(handle_symbol_queue);
  if ((int)SVar1 < 0x22) {
    if (SVar1 != L_CIRCLE_BRACKET_SYM) {
      if (SVar1 == CHARACTER_SYM) goto LAB_0012a7b8;
LAB_0012a702:
      pcVar4 = "invalid symbol in factor parse";
      pcVar3 = "";
      goto LAB_0012a870;
    }
    SymbolQueue::NextSymbol(handle_symbol_queue);
    cVar2 = Expression::Parse(&this->m_expression);
    if (cVar2 != 0) {
      pcVar4 = "expected a valid expression in bracket";
      pcVar3 = "";
      goto LAB_0012a870;
    }
    SVar1 = SymbolQueue::GetCurrentName(handle_symbol_queue);
    if (SVar1 == R_CIRCLE_BRACKET_SYM) goto LAB_0012a7b8;
  }
  else {
    if (SVar1 == INTERGER_SYM) goto LAB_0012a7b8;
    if (SVar1 != IDENTIFIER_SYM) goto LAB_0012a702;
    SymbolQueue::SetCacheLocate(handle_symbol_queue);
    SymbolQueue::NextSymbol(handle_symbol_queue);
    SVar1 = SymbolQueue::GetCurrentName(handle_symbol_queue);
    if (SVar1 != L_CIRCLE_BRACKET_SYM) {
      if (SVar1 != L_SQUARE_BRACKET_SYM) {
        SymbolQueue::SetCurrentLocate(handle_symbol_queue);
LAB_0012a7b8:
        SymbolQueue::NextSymbol(handle_symbol_queue);
        return 0;
      }
      SymbolQueue::NextSymbol(handle_symbol_queue);
      cVar2 = Expression::Parse(&this->m_expression);
      if (cVar2 == 0) {
        SVar1 = SymbolQueue::GetCurrentName(handle_symbol_queue);
        if (SVar1 == R_SQUARE_BRACKET_SYM) goto LAB_0012a7b8;
        pcVar4 = "expected a \']\'";
        pcVar3 = "";
      }
      else {
        pcVar4 = "expected a valid array index expression";
        pcVar3 = "";
      }
      goto LAB_0012a870;
    }
    SymbolQueue::NextSymbol(handle_symbol_queue);
    cVar2 = ValueArgumentList::Parse(&this->m_value_argument_list);
    if (cVar2 != 0) {
      pcVar4 = "expected a valid value argument list";
      pcVar3 = "";
      goto LAB_0012a870;
    }
    SVar1 = SymbolQueue::GetCurrentName(handle_symbol_queue);
    if (SVar1 == R_CIRCLE_BRACKET_SYM) {
      local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_38,"This is a function call","");
      LogTools::GrammaNormalLogs(g_log_tools,&local_38);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p != &local_38.field_2) {
        operator_delete(local_38._M_dataplus._M_p);
      }
      goto LAB_0012a7b8;
    }
  }
  pcVar4 = "expected a \')\'";
  pcVar3 = "";
LAB_0012a870:
  log_tools_ptr = g_log_tools;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,pcVar4,pcVar3);
  GrammaErrorLogs(log_tools_ptr,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return -1;
}

Assistant:

compile_errcode Factor::Parse() {
    int ret = COMPILE_OK;
    SymbolName name = handle_symbol_queue->GetCurrentName();
    switch (name) {
        case INTERGER_SYM: break;
        case CHARACTER_SYM: break;
        case IDENTIFIER_SYM: {
            handle_symbol_queue->SetCacheLocate();
            handle_symbol_queue->NextSymbol();
            name = handle_symbol_queue->GetCurrentName();
            if (name == L_SQUARE_BRACKET_SYM) {
                handle_symbol_queue->NextSymbol();
                if ((ret = m_expression.Parse()) == COMPILE_OK) {
                    // m_expression.LogOutput();
                    name = handle_symbol_queue->GetCurrentName();
                    if (name == R_SQUARE_BRACKET_SYM) {
                        break;
                    } else {
                        GrammaErrorLogs(g_log_tools, "expected a ']'");
                        return NOT_MATCH;
                    }
                } else {
                    GrammaErrorLogs(g_log_tools, "expected a valid array index expression");
                    return NOT_MATCH;
                }
            } else if (name == L_CIRCLE_BRACKET_SYM) {
                handle_symbol_queue->NextSymbol();
                if ((ret = m_value_argument_list.Parse()) == COMPILE_OK) {
                    // m_value_argument_list.LogOutput();
                    name = handle_symbol_queue->GetCurrentName();
                    if (name == R_CIRCLE_BRACKET_SYM) {
                        string str = "This is a function call";
                        g_log_tools->GrammaNormalLogs(str);
                        break;
                    } else {
                        GrammaErrorLogs(g_log_tools, "expected a ')'");
                        return NOT_MATCH;
                    }
                } else {
                    GrammaErrorLogs(g_log_tools, "expected a valid value argument list");
                    return NOT_MATCH;
                }
            } else {
                handle_symbol_queue->SetCurrentLocate();
                break;
            }
        }
        case L_CIRCLE_BRACKET_SYM: {
            handle_symbol_queue->NextSymbol();
            if ((ret = m_expression.Parse()) == COMPILE_OK) {
                // m_expression.LogOutput();
                name = handle_symbol_queue->GetCurrentName();
                if (name == R_CIRCLE_BRACKET_SYM) {
                    break;
                } else {
                    GrammaErrorLogs(g_log_tools, "expected a ')'");
                    return NOT_MATCH;
                }
            } else {
                GrammaErrorLogs(g_log_tools, "expected a valid expression in bracket");
                return NOT_MATCH;
            }
        }
        default: {
            GrammaErrorLogs(g_log_tools, "invalid symbol in factor parse");
            return NOT_MATCH;
        }
    }
    handle_symbol_queue->NextSymbol();
    return COMPILE_OK;
}